

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O0

VertexBuffer * __thiscall sf::VertexBuffer::operator=(VertexBuffer *this,VertexBuffer *right)

{
  undefined1 local_38 [8];
  VertexBuffer temp;
  VertexBuffer *right_local;
  VertexBuffer *this_local;
  
  temp._24_8_ = right;
  VertexBuffer((VertexBuffer *)local_38,right);
  swap(this,(VertexBuffer *)local_38);
  ~VertexBuffer((VertexBuffer *)local_38);
  return this;
}

Assistant:

VertexBuffer& VertexBuffer::operator =(const VertexBuffer& right)
{
    VertexBuffer temp(right);

    swap(temp);

    return *this;
}